

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdomhelpers.cpp
# Opt level: O1

bool __thiscall
QDomBuilder::notationDecl(QDomBuilder *this,QString *name,QString *publicId,QString *systemId)

{
  QAtomicInt *pQVar1;
  QDomDocumentTypePrivate *pQVar2;
  QDomNotationPrivate *this_00;
  
  this_00 = (QDomNotationPrivate *)operator_new(0xd8);
  QDomNotationPrivate::QDomNotationPrivate
            (this_00,this->doc,(QDomNodePrivate *)0x0,name,publicId,systemId);
  LOCK();
  pQVar1 = &(this_00->super_QDomNodePrivate).ref;
  (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  pQVar2 = (this->doc->type).d.ptr;
  (*(pQVar2->super_QDomNodePrivate)._vptr_QDomNodePrivate[7])(pQVar2,this_00);
  return true;
}

Assistant:

bool QDomBuilder::notationDecl(const QString &name, const QString &publicId,
                               const QString &systemId)
{
    QDomNotationPrivate *n = new QDomNotationPrivate(doc, nullptr, name, publicId, systemId);
    // keep the refcount balanced: appendChild() does a ref anyway.
    n->ref.deref();
    doc->doctype()->appendChild(n);
    return true;
}